

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
webfront::http::Headers::getHeaderValue_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Headers *this,string_view headerName)

{
  pointer pHVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pHVar4;
  size_type *psVar5;
  string_view s1;
  
  pHVar4 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pHVar4 != pHVar1) {
    psVar5 = &(pHVar4->value)._M_string_length;
    do {
      s1._M_str = (char *)psVar5[-5];
      s1._M_len = psVar5[-4];
      bVar3 = caseInsensitiveEqual(s1,headerName);
      if (bVar3) {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10);
        pcVar2 = (((string *)(psVar5 + -1))->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + *psVar5);
        bVar3 = true;
        goto LAB_00112eba;
      }
      pHVar4 = (pointer)(psVar5 + 3);
      psVar5 = psVar5 + 8;
    } while (pHVar4 != pHVar1);
  }
  bVar3 = false;
LAB_00112eba:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::optional<std::string> getHeaderValue(std::string_view headerName) const {
        for (auto& header : headers)
            if (caseInsensitiveEqual(header.name, headerName)) return header.value;
        return {};
    }